

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O2

int wally_psbt_add_input_at(wally_psbt *psbt,uint32_t index,uint32_t flags,wally_tx_input *input)

{
  wally_tx *tx;
  int iVar1;
  ulong num_items;
  ulong index_00;
  wally_tx_input local_100;
  
  iVar1 = -2;
  if ((((psbt != (wally_psbt *)0x0) && (tx = psbt->tx, tx != (wally_tx *)0x0)) && (flags < 2)) &&
     ((tx->num_inputs == psbt->num_inputs &&
      (index_00 = (ulong)index, input != (wally_tx_input *)0x0 && index_00 <= tx->num_inputs)))) {
    memcpy(&local_100,input,0xd0);
    if (flags != 0) {
      local_100.script = (uchar *)0x0;
      local_100.script_len = 0;
      local_100.witness = (wally_tx_witness_stack *)0x0;
    }
    iVar1 = wally_tx_add_input_at(tx,index,&local_100);
    wally_clear(&local_100,0xd0);
    if (iVar1 == 0) {
      num_items = psbt->num_inputs;
      if (psbt->inputs_allocation_len <= num_items) {
        iVar1 = array_grow(&psbt->inputs,num_items,&psbt->inputs_allocation_len,0x110);
        if (iVar1 != 0) {
          wally_tx_remove_input(psbt->tx,index_00);
          return iVar1;
        }
        num_items = psbt->num_inputs;
      }
      memmove(psbt->inputs + index_00 + 1,psbt->inputs + index_00,(num_items - index_00) * 0x110);
      wally_clear(psbt->inputs + index_00,0x110);
      psbt->num_inputs = psbt->num_inputs + 1;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int wally_psbt_add_input_at(struct wally_psbt *psbt,
                            uint32_t index, uint32_t flags,
                            const struct wally_tx_input *input)
{
    struct wally_tx_input tmp;
    int ret;

    if (!psbt || !psbt->tx || psbt->tx->num_inputs != psbt->num_inputs ||
        (flags & ~WALLY_PSBT_FLAG_NON_FINAL) ||
        index > psbt->num_inputs || !input)
        return WALLY_EINVAL;

    memcpy(&tmp, input, sizeof(tmp));
    if (flags & WALLY_PSBT_FLAG_NON_FINAL) {
        /* Clear scriptSig and witness before adding */
        tmp.script = NULL;
        tmp.script_len = 0;
        tmp.witness = NULL;
    }
    ret = wally_tx_add_input_at(psbt->tx, index, &tmp);
    wally_clear(&tmp, sizeof(tmp));

    if (ret == WALLY_OK) {
        if (psbt->num_inputs >= psbt->inputs_allocation_len) {
            ret = array_grow((void *)&psbt->inputs, psbt->num_inputs,
                             &psbt->inputs_allocation_len,
                             sizeof(struct wally_psbt_input));
            if (ret != WALLY_OK) {
                wally_tx_remove_input(psbt->tx, index);
                return ret;
            }
        }

        memmove(psbt->inputs + index + 1, psbt->inputs + index,
                (psbt->num_inputs - index) * sizeof(struct wally_psbt_input));
        wally_clear(psbt->inputs + index, sizeof(struct wally_psbt_input));
        psbt->num_inputs += 1;
    }
    return ret;
}